

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall nonius::reporter::configure(reporter *this,configuration *cfg)

{
  long lVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  undefined8 *puVar3;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> ofs;
  basic_ofstream<char,_std::char_traits<char>_> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  anon_class_16_1_ba1d68dc local_30;
  
  if ((cfg->output_file)._M_string_length == 0) {
    std::function<std::ostream&()>::operator=
              ((function<std::ostream&()> *)&this->os,(anon_class_1_0_00000001 *)&local_40);
  }
  else {
    local_40 = (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::ofstream,std::allocator<std::ofstream>,std::__cxx11::string&>
              (&local_38,&local_40,
               (allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)&local_30,
               &cfg->output_file);
    local_30.ofs.
    super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_40;
    local_30.ofs.
    super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = local_38._M_pi;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      }
    }
    std::function<std::ostream&()>::operator=((function<std::ostream&()> *)&this->os,&local_30);
    if (local_30.ofs.
        super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.ofs.
                 super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
  }
  if ((this->os).super__Function_base._M_manager != (_Manager_type)0x0) {
    pbVar2 = (*(this->os)._M_invoker)((_Any_data *)&this->os);
    lVar1 = *(long *)(*(long *)pbVar2 + -0x18);
    *(undefined4 *)(pbVar2 + lVar1 + 0x1c) = 4;
    std::ios::clear((int)pbVar2 + (int)lVar1);
    if ((this->os).super__Function_base._M_manager != (_Manager_type)0x0) {
      pbVar2 = (*(this->os)._M_invoker)((_Any_data *)&this->os);
      if (((byte)pbVar2[*(long *)(*(long *)pbVar2 + -0x18) + 0x20] & 5) == 0) {
        (*this->_vptr_reporter[3])(this,cfg);
        return;
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__bad_stream_0020c278;
      __cxa_throw(puVar3,&bad_stream::typeinfo,bad_stream::~bad_stream);
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void configure(configuration& cfg) {
            if(cfg.output_file.empty()) {
                os = [&]() -> std::ostream& { return std::cout; };
            } else {
                auto ofs = std::make_shared<std::ofstream>(cfg.output_file);
                os = [ofs]() -> std::ostream& { return *ofs; };
            }
            report_stream().exceptions(std::ios::failbit);
            if(!report_stream()) throw bad_stream();
            do_configure(cfg);
        }